

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O3

void skiwi::save_before_foreign_call(asmcode *code)

{
  operand local_40 [3];
  operation local_34;
  
  local_34 = SUB;
  local_40[2] = 0xf;
  local_40[1] = 0x39;
  local_40[0] = ST6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_34,local_40 + 2,local_40 + 1,(int *)local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0;
  local_40[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 8;
  local_40[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x10;
  local_40[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x18;
  local_40[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x20;
  local_40[0] = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x28;
  local_40[0] = R8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x30;
  local_40[0] = R9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 0x38;
  local_40[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0xf0;
  local_40[0] = R13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  return;
}

Assistant:

void save_before_foreign_call(asmcode& code)
  {
  /*
  sub rsp, CELLS(8)
  mov [rsp + CELLS(0)], rbx
  mov [rsp + CELLS(1)], rcx
  mov [rsp + CELLS(2)], rdx
  mov [rsp + CELLS(3)], rsi
  mov [rsp + CELLS(4)], rdi
  mov [rsp + CELLS(5)], r8
  mov [rsp + CELLS(6)], r9
  mov [rsp + CELLS(7)], r10
  */
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, CELLS(8));
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(0), asmcode::RBX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(1), asmcode::RCX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(2), asmcode::RDX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(3), asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(4), asmcode::RDI);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(5), asmcode::R8);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(6), asmcode::R9);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(7), asmcode::R10);

  code.add(asmcode::MOV, STACK, STACK_REGISTER); // We save the current stack position in the context, so that any load or eval functions start from the correct stack position.
                                                 // This is important for the garbage collector.
  }